

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrap.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  bool bVar2;
  _Setfill<char> _Var3;
  _Setw _Var4;
  ostream *poVar5;
  long *plVar6;
  int local_440;
  int rowCount;
  uint8_t value;
  ofstream outFile;
  char local_228 [8];
  ifstream inFile;
  int rowLength;
  char **argv_local;
  int argc_local;
  
  std::ifstream::ifstream(local_228,argv[1],_S_bin);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    argv_local._4_4_ = 1;
  }
  else {
    std::ofstream::ofstream(&rowCount,argv[2],_S_out);
    bVar1 = std::ofstream::is_open();
    if ((bVar1 & 1) == 0) {
      argv_local._4_4_ = 1;
    }
    else {
      std::ostream::operator<<((ostream *)&rowCount,std::hex);
      std::operator<<((ostream *)&rowCount,"#include <vector>\n\n");
      poVar5 = std::operator<<((ostream *)&rowCount,"const std::vector<std::uint8_t> ");
      poVar5 = std::operator<<(poVar5,argv[3]);
      std::operator<<(poVar5," = {");
      local_440 = 0;
      while( true ) {
        plVar6 = (long *)std::istream::get(local_228);
        bVar2 = std::ios::operator_cast_to_bool((ios *)((long)plVar6 + *(long *)(*plVar6 + -0x18)));
        if (!bVar2) break;
        if (local_440 == 0) {
          std::operator<<((ostream *)&rowCount,"\n\t");
        }
        poVar5 = std::operator<<((ostream *)&rowCount,"0x");
        _Var4 = std::setw(2);
        poVar5 = std::operator<<(poVar5,_Var4);
        _Var3 = std::setfill<char>('0');
        poVar5 = std::operator<<(poVar5,_Var3._M_c);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0);
        std::operator<<(poVar5,",");
        local_440 = (local_440 + 1) % 0x20;
      }
      std::operator<<((ostream *)&rowCount,"\n};\n");
      argv_local._4_4_ = 0;
    }
    std::ofstream::~ofstream(&rowCount);
  }
  std::ifstream::~ifstream(local_228);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[])
{
	const int rowLength = 32;

	std::ifstream inFile(argv[1], std::ios::binary);
	if (!inFile.is_open()) return EXIT_FAILURE;

	std::ofstream outFile(argv[2]);
	if (!outFile.is_open()) return EXIT_FAILURE;

	outFile << std::hex;
	outFile << "#include <vector>\n\n";
	outFile << "const std::vector<std::uint8_t> " << argv[3] << " = {";

	std::uint8_t value = 0;
	int rowCount = 0;

	while (inFile.get(reinterpret_cast<char&>(value)))
	{
		if (rowCount++ == 0)
		{
			outFile << "\n\t";
		}

		outFile << "0x" << std::setw(2) << std::setfill('0') << static_cast<std::uint32_t>(value) << ",";

		rowCount %= rowLength;
	}

	outFile << "\n};\n";

	return EXIT_SUCCESS;
}